

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::SendRTCPData(RTPUDPv4Transmitter *this,void *data,size_t len)

{
  HashElement *pHVar1;
  int iVar2;
  
  iVar2 = -0x5a;
  if (((this->init == true) && (iVar2 = -0x59, this->created == true)) &&
     (iVar2 = -0x5d, len <= this->maxpacksize)) {
    pHVar1 = (this->destinations).firsthashelem;
    (this->destinations).curhashelem = pHVar1;
    while (pHVar1 != (HashElement *)0x0) {
      sendto(this->rtcpsock,data,len,0,(sockaddr *)&(pHVar1->element).rtcpaddr,0x10);
      pHVar1 = (this->destinations).curhashelem;
      if (pHVar1 != (HashElement *)0x0) {
        (this->destinations).curhashelem = pHVar1->listnext;
      }
      pHVar1 = (this->destinations).curhashelem;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int RTPUDPv4Transmitter::SendRTCPData(const void *data,size_t len)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	destinations.GotoFirstElement();
	while (destinations.HasCurrentElement())
	{
		sendto(rtcpsock,(const char *)data,len,0,(const struct sockaddr *)destinations.GetCurrentElement().GetRTCPSockAddr(),sizeof(struct sockaddr_in));
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}